

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapIterator<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>,_false>
::RetreatPastEmptyBuckets
          (DenseMapIterator<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>,_false>
           *this)

{
  bool bVar1;
  DBKeyID *pDVar2;
  bool local_2a;
  bool local_29;
  DBKeyID local_20;
  DBKeyID Tombstone;
  DBKeyID Empty;
  DenseMapIterator<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>,_false>
  *this_local;
  
  if (this->End <= this->Ptr) {
    Tombstone = DenseMapInfo<DBKeyID>::getEmptyKey();
    local_20 = DenseMapInfo<DBKeyID>::getTombstoneKey();
    while( true ) {
      local_29 = false;
      if (this->Ptr != this->End) {
        pDVar2 = detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getFirst(this->Ptr + -1);
        bVar1 = DenseMapInfo<DBKeyID>::isEqual(pDVar2,&Tombstone);
        local_2a = true;
        if (!bVar1) {
          pDVar2 = detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getFirst(this->Ptr + -1);
          local_2a = DenseMapInfo<DBKeyID>::isEqual(pDVar2,&local_20);
        }
        local_29 = local_2a;
      }
      if (local_29 == false) break;
      this->Ptr = this->Ptr + -1;
    }
    return;
  }
  __assert_fail("Ptr >= End",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                ,0x4b7,
                "void llvm::DenseMapIterator<DBKeyID, llbuild::core::KeyID>::RetreatPastEmptyBuckets() [KeyT = DBKeyID, ValueT = llbuild::core::KeyID, KeyInfoT = llvm::DenseMapInfo<DBKeyID>, Bucket = llvm::detail::DenseMapPair<DBKeyID, llbuild::core::KeyID>, IsConst = false]"
               );
}

Assistant:

void RetreatPastEmptyBuckets() {
    assert(Ptr >= End);
    const KeyT Empty = KeyInfoT::getEmptyKey();
    const KeyT Tombstone = KeyInfoT::getTombstoneKey();

    while (Ptr != End && (KeyInfoT::isEqual(Ptr[-1].getFirst(), Empty) ||
                          KeyInfoT::isEqual(Ptr[-1].getFirst(), Tombstone)))
      --Ptr;
  }